

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O1

void hash_destroy(HashTable *table)

{
  MOJOSHADER_free UNRECOVERED_JUMPTABLE;
  void *pvVar1;
  void *pvVar2;
  HashItem *pHVar3;
  HashItem *pHVar4;
  ulong uVar5;
  
  UNRECOVERED_JUMPTABLE = table->f;
  pvVar1 = table->d;
  if (table->table_len != 0) {
    pvVar2 = table->data;
    uVar5 = 0;
    do {
      pHVar4 = table->table[uVar5];
      while (pHVar4 != (HashItem *)0x0) {
        pHVar3 = pHVar4->next;
        (*table->nuke)(pHVar4->key,pHVar4->value,pvVar2);
        (*UNRECOVERED_JUMPTABLE)(pHVar4,pvVar1);
        pHVar4 = pHVar3;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < table->table_len);
  }
  (*UNRECOVERED_JUMPTABLE)(table->table,pvVar1);
  (*UNRECOVERED_JUMPTABLE)(table,pvVar1);
  return;
}

Assistant:

void hash_destroy(HashTable *table)
{
    uint32 i;
    void *data = table->data;
    MOJOSHADER_free f = table->f;
    void *d = table->d;
    for (i = 0; i < table->table_len; i++)
    {
        HashItem *item = table->table[i];
        while (item != NULL)
        {
            HashItem *next = item->next;
            table->nuke(item->key, item->value, data);
            f(item, d);
            item = next;
        } // while
    } // for

    f(table->table, d);
    f(table, d);
}